

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiDeviceInitializationTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::createDeviceWithUnsupportedExtensionsTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  PlatformInterface *vkPlatform;
  VkInstance_s *pVVar1;
  char *__s;
  TestStatus *pTVar2;
  undefined1 auVar3 [8];
  DestroyInstanceFunc p_Var4;
  VkAllocationCallbacks *pVVar5;
  VkResult VVar6;
  VkPhysicalDevice pVVar7;
  size_t sVar8;
  TestError *this;
  int ndx;
  long lVar9;
  VkDevice device;
  float queuePriority;
  char *enabledExtensions [3];
  VkDeviceCreateInfo deviceCreateInfo;
  DeviceDriver deviceIface;
  InstanceDriver instanceDriver;
  VkDevice local_718;
  VkPhysicalDevice local_710;
  TestStatus *local_708;
  float local_6fc;
  char *local_6f8 [3];
  VkDeviceCreateInfo local_6e0;
  undefined1 local_698 [8];
  DestroyInstanceFunc local_690;
  VkAllocationCallbacks *local_688 [13];
  ios_base local_620 [1088];
  VkDeviceQueueCreateInfo local_1e0;
  InstanceDriver local_1b8;
  
  vkPlatform = context->m_platformInterface;
  pVVar1 = (VkInstance_s *)context->m_testCtx->m_log;
  ::vk::createDefaultInstance((Move<vk::VkInstance_s_*> *)local_698,vkPlatform);
  pVVar5 = local_688[0];
  p_Var4 = local_690;
  auVar3 = local_698;
  ::vk::InstanceDriver::InstanceDriver(&local_1b8,vkPlatform,(VkInstance)local_698);
  local_6f8[2] = "VK_DONT_SUPPORT_ME";
  local_6f8[0] = "VK_UNSUPPORTED_EXTENSION";
  local_6f8[1] = "THIS_IS_NOT_AN_EXTENSION";
  local_708 = __return_storage_ptr__;
  pVVar7 = ::vk::chooseDevice(&local_1b8.super_InstanceInterface,(VkInstance)local_698,
                              context->m_testCtx->m_cmdLine);
  local_1e0.pQueuePriorities = &local_6fc;
  local_6fc = 1.0;
  local_6e0.pQueueCreateInfos = &local_1e0;
  local_1e0.sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
  local_1e0.pNext = (void *)0x0;
  local_1e0.flags = 0;
  local_1e0.queueFamilyIndex = 0;
  local_1e0.queueCount = 1;
  local_6e0.sType = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
  local_6e0.pNext = (void *)0x0;
  local_6e0.flags = 0;
  local_6e0.queueCreateInfoCount = 1;
  local_6e0.enabledLayerCount = 0;
  local_6e0.ppEnabledLayerNames = (char **)0x0;
  local_6e0.enabledExtensionCount = 3;
  local_6e0.ppEnabledExtensionNames = local_6f8;
  local_6e0.pEnabledFeatures = (VkPhysicalDeviceFeatures *)0x0;
  local_698 = (undefined1  [8])pVVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_690);
  local_710 = pVVar7;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_690,"Enabled extensions are: ",0x18);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_698,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_690);
  std::ios_base::~ios_base(local_620);
  lVar9 = 0;
  do {
    local_698 = (undefined1  [8])pVVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_690);
    __s = local_6f8[lVar9];
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(local_690 + -0x18) + (int)(ostringstream *)&local_690);
    }
    else {
      sVar8 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_690,__s,sVar8);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_698,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_690);
    std::ios_base::~ios_base(local_620);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  local_718 = (VkDevice)0x0;
  VVar6 = ::vk::InstanceDriver::createDevice
                    (&local_1b8,local_710,&local_6e0,(VkAllocationCallbacks *)0x0,&local_718);
  pTVar2 = local_708;
  if (local_718 == (VkDevice)0x0) {
    if (VVar6 == VK_ERROR_EXTENSION_NOT_PRESENT) {
      local_698 = (undefined1  [8])local_688;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_698,"Pass, create device with unsupported extension is rejected.",
                 "");
      pTVar2->m_code = QP_TEST_RESULT_PASS;
      (pTVar2->m_description)._M_dataplus._M_p = (pointer)&(pTVar2->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pTVar2->m_description,local_698,local_690 + (long)local_698);
      goto LAB_003c73cb;
    }
  }
  else {
    ::vk::DeviceDriver::DeviceDriver
              ((DeviceDriver *)local_698,&local_1b8.super_InstanceInterface,local_718);
    ::vk::DeviceDriver::destroyDevice
              ((DeviceDriver *)local_698,local_718,(VkAllocationCallbacks *)0x0);
    ::vk::DeviceDriver::~DeviceDriver((DeviceDriver *)local_698);
    if (VVar6 == VK_ERROR_EXTENSION_NOT_PRESENT) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,(char *)0x0,"!gotDevice",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiDeviceInitializationTests.cpp"
                 ,0x216);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  local_698 = (undefined1  [8])local_688;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_698,"Fail, create device with unsupported extension but succeed.","");
  pTVar2->m_code = QP_TEST_RESULT_FAIL;
  (pTVar2->m_description)._M_dataplus._M_p = (pointer)&(pTVar2->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar2->m_description,local_698,local_690 + (long)local_698);
LAB_003c73cb:
  if (local_698 != (undefined1  [8])local_688) {
    operator_delete((void *)local_698,(ulong)((long)&local_688[0]->pUserData + 1));
  }
  ::vk::InstanceDriver::~InstanceDriver(&local_1b8);
  if (auVar3 != (undefined1  [8])0x0) {
    (*p_Var4)((VkInstance)auVar3,pVVar5);
  }
  return pTVar2;
}

Assistant:

tcu::TestStatus createDeviceWithUnsupportedExtensionsTest (Context& context)
{
	tcu::TestLog&					log						= context.getTestContext().getLog();
	const PlatformInterface&		platformInterface		= context.getPlatformInterface();
	const Unique<VkInstance>		instance				(createDefaultInstance(platformInterface));
	const InstanceDriver			instanceDriver			(platformInterface, instance.get());
	const char*						enabledExtensions[]		= {"VK_UNSUPPORTED_EXTENSION", "THIS_IS_NOT_AN_EXTENSION", "VK_DONT_SUPPORT_ME"};
	const VkPhysicalDevice			physicalDevice			= chooseDevice(instanceDriver, instance.get(), context.getTestContext().getCommandLine());
	const float						queuePriority			= 1.0f;
	const VkDeviceQueueCreateInfo	deviceQueueCreateInfo	=
	{
		VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO,
		DE_NULL,
		(VkDeviceQueueCreateFlags)0u,
		0,										//queueFamilyIndex;
		1,										//queueCount;
		&queuePriority,							//pQueuePriorities;
	};
	const VkDeviceCreateInfo		deviceCreateInfo		=
	{
		VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO,	//sType;
		DE_NULL,								//pNext;
		(VkDeviceCreateFlags)0u,
		1,										//queueRecordCount;
		&deviceQueueCreateInfo,					//pRequestedQueues;
		0,										//layerCount;
		DE_NULL,								//ppEnabledLayerNames;
		DE_LENGTH_OF_ARRAY(enabledExtensions),	//extensionCount;
		enabledExtensions,						//ppEnabledExtensionNames;
		DE_NULL,								//pEnabledFeatures;
	};

	log << TestLog::Message << "Enabled extensions are: " << TestLog::EndMessage;

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(enabledExtensions); ndx++)
		log << TestLog::Message << enabledExtensions[ndx] <<  TestLog::EndMessage;

	{
		VkDevice		device		= (VkDevice)0;
		const VkResult	result		= instanceDriver.createDevice(physicalDevice, &deviceCreateInfo, DE_NULL/*pAllocator*/, &device);
		const bool		gotDevice	= !!device;

		if (device)
		{
			const DeviceDriver	deviceIface	(instanceDriver, device);
			deviceIface.destroyDevice(device, DE_NULL/*pAllocator*/);
		}

		if (result == VK_ERROR_EXTENSION_NOT_PRESENT)
		{
			TCU_CHECK(!gotDevice);
			return tcu::TestStatus::pass("Pass, create device with unsupported extension is rejected.");
		}
		else
			return tcu::TestStatus::fail("Fail, create device with unsupported extension but succeed.");
	}
}